

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char * str_replace_many(char *_haystack,...)

{
  char in_AL;
  uint uVar1;
  char *haystack;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_RCX;
  void **ppvVar4;
  void **ppvVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &ap[0].overflow_arg_area;
  uVar1 = 8;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  haystack = strdup(_haystack);
  while( true ) {
    uVar2 = (ulong)uVar1;
    if (uVar2 < 0x29) {
      ppvVar4 = (void **)((long)local_c8 + uVar2);
      uVar1 = uVar1 + 8;
      uVar2 = (ulong)uVar1;
    }
    else {
      ppvVar4 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if ((char *)*ppvVar4 == (char *)0x0) break;
    if ((uint)uVar2 < 0x29) {
      uVar1 = (uint)uVar2 + 8;
      ppvVar5 = (void **)((long)local_c8 + uVar2);
    }
    else {
      ppvVar5 = local_e0;
      local_e0 = local_e0 + 1;
    }
    pcVar3 = str_replace(haystack,(char *)*ppvVar4,(char *)*ppvVar5);
    free(haystack);
    haystack = pcVar3;
  }
  return haystack;
}

Assistant:

char *str_replace_many(const char *_haystack, ...)
{
    va_list ap;
    va_start(ap, _haystack);

    char *haystack = strdup(_haystack);

    while (true) {
        char *needle = va_arg(ap, char*);
        if (!needle)
            break;

        char *replacement = va_arg(ap, char*);
        char *tmp = str_replace(haystack, needle, replacement);
        free(haystack);
        haystack = tmp;
    }

    va_end(ap);

    return haystack;
}